

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O1

void __thiscall cs::statement_loop::run_impl(statement_loop *this)

{
  context_t *pcVar1;
  element_type *peVar2;
  _Elt_pointer ppsVar3;
  statement_base *psVar4;
  bool bVar5;
  undefined *puVar6;
  int iVar7;
  _Map_pointer pppsVar8;
  _Elt_pointer ppsVar9;
  _Elt_pointer ppsVar10;
  scope_guard scope;
  scope_guard local_a0;
  statement_loop *local_98;
  
  peVar2 = (((this->super_statement_base).context.
             super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->instance).
           super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2->break_block == true) {
    peVar2->break_block = false;
  }
  pcVar1 = &(this->super_statement_base).context;
  if (peVar2->continue_block == true) {
    peVar2->continue_block = false;
  }
  local_a0.context = pcVar1;
  domain_manager::add_domain(&(peVar2->super_runtime_type).storage);
  local_98 = this;
  do {
    puVar6 = current_process;
    if ((*current_process & 1) != 0) {
      LOCK();
      *current_process = 0;
      UNLOCK();
      event_type::touch((event_type *)(puVar6 + 0xd0),(void *)0x0);
    }
    ppsVar9 = (this->mBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_start._M_cur;
    ppsVar3 = (this->mBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_finish._M_cur;
    if (ppsVar9 != ppsVar3) {
      ppsVar10 = (this->mBlock).
                 super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_last;
      pppsVar8 = (this->mBlock).
                 super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_node;
      do {
        puVar6 = current_process;
        psVar4 = *ppsVar9;
        if ((*current_process & 1) != 0) {
          LOCK();
          *current_process = 0;
          UNLOCK();
          event_type::touch((event_type *)(puVar6 + 0xd0),(void *)0x0);
        }
        (*psVar4->_vptr_statement_base[3])(psVar4);
        peVar2 = (((pcVar1->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  )->instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        iVar7 = 1;
        if (peVar2->return_fcall == false) {
          if (peVar2->break_block == true) {
            peVar2->break_block = false;
            goto LAB_0016a9be;
          }
          if (peVar2->continue_block == true) {
            peVar2->continue_block = false;
            iVar7 = 4;
            goto LAB_0016a9be;
          }
          iVar7 = 0;
          bVar5 = true;
        }
        else {
LAB_0016a9be:
          bVar5 = false;
        }
        if (!bVar5) goto LAB_0016a9f3;
        ppsVar9 = ppsVar9 + 1;
        if (ppsVar9 == ppsVar10) {
          ppsVar9 = pppsVar8[1];
          pppsVar8 = pppsVar8 + 1;
          ppsVar10 = ppsVar9 + 0x40;
        }
      } while (ppsVar9 != ppsVar3);
      iVar7 = 4;
LAB_0016a9f3:
      this = local_98;
      if (iVar7 != 4) {
        scope_guard::~scope_guard(&local_a0);
        return;
      }
    }
    domain_manager::next_domain
              (&((((((local_a0.context)->
                    super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                  instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->super_runtime_type).storage);
  } while( true );
}

Assistant:

void statement_loop::run_impl()
	{
		CS_DEBUGGER_STEP(this);
		if (context->instance->break_block)
			context->instance->break_block = false;
		if (context->instance->continue_block)
			context->instance->continue_block = false;
		scope_guard scope(context);
		while (true) {
			current_process->poll_event();
			for (auto &ptr: mBlock) {
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
				}
				if (context->instance->return_fcall) {
					return;
				}
				if (context->instance->break_block) {
					context->instance->break_block = false;
					return;
				}
				if (context->instance->continue_block) {
					context->instance->continue_block = false;
					break;
				}
			}
			scope.clear();
		}
	}